

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_crc32.c
# Opt level: O1

uint32_t calculate_crc32c(uint32_t crc32c,uchar *buffer,uint length)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  uVar2 = (ulong)crc32c;
  if (3 < length) {
    uVar3 = (uint)buffer & 3;
    uVar9 = 4 - uVar3;
    uVar4 = length - uVar9;
    lVar7 = 0;
    do {
      uVar1 = (uint)(uVar2 >> 8) ^ crc32Table[(byte)(buffer[lVar7] ^ (byte)uVar2)];
      uVar2 = (ulong)uVar1;
      lVar7 = lVar7 + 1;
    } while (4 - uVar3 != (int)lVar7);
    puVar6 = (uint *)(buffer + uVar9);
    if (7 < uVar4) {
      iVar8 = (uVar4 >> 3) + (uint)(uVar4 >> 3 == 0);
      do {
        uVar9 = (uint)uVar2 ^ *puVar6;
        uVar3 = puVar6[1];
        uVar1 = sctp_crc_tableil8_o80[uVar9 >> 8 & 0xff] ^ sctp_crc_tableil8_o88[uVar9 & 0xff] ^
                *(uint *)((long)sctp_crc_tableil8_o72 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                sctp_crc_tableil8_o64[uVar9 >> 0x18] ^ sctp_crc_tableil8_o56[uVar3 & 0xff] ^
                sctp_crc_tableil8_o48[uVar3 >> 8 & 0xff] ^
                *(uint *)((long)sctp_crc_tableil8_o40 + (ulong)(uVar3 >> 0xe & 0x3fc)) ^
                crc32Table[uVar3 >> 0x18];
        puVar6 = puVar6 + 2;
        uVar2 = (ulong)uVar1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    if ((uVar4 & 7) != 0) {
      lVar7 = 0;
      do {
        uVar1 = uVar1 >> 8 ^ crc32Table[(byte)(*(byte *)((long)puVar6 + lVar7) ^ (byte)uVar1)];
        lVar7 = lVar7 + 1;
      } while (((byte)((char)length + ((byte)buffer & 3) + 4) & 7) != (uint)lVar7);
    }
    return uVar1;
  }
  if (length != 0) {
    uVar5 = 0;
    do {
      crc32c = (uint)(uVar2 >> 8) ^ crc32Table[(byte)(buffer[uVar5] ^ (byte)uVar2)];
      uVar2 = (ulong)crc32c;
      uVar5 = uVar5 + 1;
    } while (length != uVar5);
  }
  return crc32c;
}

Assistant:

uint32_t calculate_crc32c(uint32_t crc32c, const unsigned char *buffer,
			  unsigned int length)
{
	if (length < 4)
		return (singletable_crc32c(crc32c, buffer, length));
	else
		return (multitable_crc32c(crc32c, buffer, length));
}